

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O0

void __thiscall rpc_tests::rpc_createraw_op_return::test_method(rpc_createraw_op_return *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  runtime_error *ex_2;
  runtime_error *ex_1;
  runtime_error *ex;
  UniValue *in_stack_fffffffffffff778;
  undefined7 in_stack_fffffffffffff780;
  undefined1 in_stack_fffffffffffff787;
  assertion_result *in_stack_fffffffffffff788;
  undefined7 in_stack_fffffffffffff7a0;
  undefined1 in_stack_fffffffffffff7a7;
  lazy_ostream *in_stack_fffffffffffff7a8;
  const_string *in_stack_fffffffffffff7b0;
  const_string *file;
  allocator<char> *in_stack_fffffffffffff7b8;
  allocator<char> *__a;
  char *in_stack_fffffffffffff7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7c8;
  undefined7 in_stack_fffffffffffff818;
  undefined1 in_stack_fffffffffffff81f;
  lazy_ostream *in_stack_fffffffffffff820;
  const_string local_690;
  lazy_ostream local_680 [2];
  assertion_result local_660 [2];
  allocator<char> local_621 [105];
  const_string local_5b8;
  lazy_ostream local_5a8 [2];
  assertion_result local_588 [2];
  allocator<char> local_549 [137];
  const_string local_4c0;
  lazy_ostream local_4b0 [2];
  assertion_result local_490 [2];
  allocator<char> local_451 [137];
  const_string local_3c8;
  lazy_ostream local_3b8 [2];
  assertion_result local_398 [2];
  allocator<char> local_359 [137];
  const_string local_2d0;
  lazy_ostream local_2c0 [2];
  assertion_result local_2a0 [2];
  allocator<char> local_261 [601];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
    RPCTestingSetup::CallRPC
              ((RPCTestingSetup *)in_stack_fffffffffffff820,
               (string *)CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818));
    UniValue::~UniValue(in_stack_fffffffffffff778);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff778);
    std::allocator<char>::~allocator(local_261);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff788,
                 (pointer)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780),
                 (unsigned_long)in_stack_fffffffffffff778);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff778);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0,
                 (size_t)in_stack_fffffffffffff7a8,
                 (const_string *)CONCAT17(in_stack_fffffffffffff7a7,in_stack_fffffffffffff7a0));
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffff788,(bool)in_stack_fffffffffffff787);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780),
                 (char (*) [185])in_stack_fffffffffffff778);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff788,
                 (pointer)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780),
                 (unsigned_long)in_stack_fffffffffffff778);
      in_stack_fffffffffffff778 = (UniValue *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_2a0,local_2c0,&local_2d0,0xd6,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[185],_const_char_(&)[185]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[185],_const_char_(&)[185]>
                          *)in_stack_fffffffffffff778);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff778);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff788,
               (pointer)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780),
               (unsigned_long)in_stack_fffffffffffff778);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff778);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0,
               (size_t)in_stack_fffffffffffff7a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff7a7,in_stack_fffffffffffff7a0));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
    RPCTestingSetup::CallRPC
              ((RPCTestingSetup *)in_stack_fffffffffffff820,
               (string *)CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818));
    UniValue::~UniValue(in_stack_fffffffffffff778);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff778);
    std::allocator<char>::~allocator(local_359);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff788,
                 (pointer)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780),
                 (unsigned_long)in_stack_fffffffffffff778);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff778);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0,
                 (size_t)in_stack_fffffffffffff7a8,
                 (const_string *)CONCAT17(in_stack_fffffffffffff7a7,in_stack_fffffffffffff7a0));
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffff788,(bool)in_stack_fffffffffffff787);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780),
                 (char (*) [53])in_stack_fffffffffffff778);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff788,
                 (pointer)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780),
                 (unsigned_long)in_stack_fffffffffffff778);
      in_stack_fffffffffffff778 = (UniValue *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_398,local_3b8,&local_3c8,0xd9,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_fffffffffffff778);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff778);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff788,
               (pointer)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780),
               (unsigned_long)in_stack_fffffffffffff778);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff778);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0,
               (size_t)in_stack_fffffffffffff7a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff7a7,in_stack_fffffffffffff7a0));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
    RPCTestingSetup::CallRPC
              ((RPCTestingSetup *)in_stack_fffffffffffff820,
               (string *)CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818));
    UniValue::~UniValue(in_stack_fffffffffffff778);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff778);
    std::allocator<char>::~allocator(local_451);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff788,
                 (pointer)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780),
                 (unsigned_long)in_stack_fffffffffffff778);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff778);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0,
                 (size_t)in_stack_fffffffffffff7a8,
                 (const_string *)CONCAT17(in_stack_fffffffffffff7a7,in_stack_fffffffffffff7a0));
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffff788,(bool)in_stack_fffffffffffff787);
      in_stack_fffffffffffff820 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780),
                 (char (*) [53])in_stack_fffffffffffff778);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff788,
                 (pointer)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780),
                 (unsigned_long)in_stack_fffffffffffff778);
      in_stack_fffffffffffff778 = (UniValue *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_490,local_4b0,&local_4c0,0xdc,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_fffffffffffff778);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff778);
      in_stack_fffffffffffff81f = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffff81f);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff788,
               (pointer)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780),
               (unsigned_long)in_stack_fffffffffffff778);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff778);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0,
               (size_t)in_stack_fffffffffffff7a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff7a7,in_stack_fffffffffffff7a0));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
    RPCTestingSetup::CallRPC
              ((RPCTestingSetup *)in_stack_fffffffffffff820,
               (string *)CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818));
    UniValue::~UniValue(in_stack_fffffffffffff778);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff778);
    std::allocator<char>::~allocator(local_549);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff788,
                 (pointer)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780),
                 (unsigned_long)in_stack_fffffffffffff778);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff778);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0,
                 (size_t)in_stack_fffffffffffff7a8,
                 (const_string *)CONCAT17(in_stack_fffffffffffff7a7,in_stack_fffffffffffff7a0));
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffff788,(bool)in_stack_fffffffffffff787);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780),
                 (char (*) [53])in_stack_fffffffffffff778);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff788,
                 (pointer)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780),
                 (unsigned_long)in_stack_fffffffffffff778);
      in_stack_fffffffffffff778 = (UniValue *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_588,local_5a8,&local_5b8,0xdd,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_fffffffffffff778);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff778);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    __a = local_621;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0,__a);
    RPCTestingSetup::CallRPC
              ((RPCTestingSetup *)in_stack_fffffffffffff820,
               (string *)CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818));
    UniValue::~UniValue(in_stack_fffffffffffff778);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff778);
    std::allocator<char>::~allocator(local_621);
    do {
      file = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff788,
                 (pointer)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780),
                 (unsigned_long)in_stack_fffffffffffff778);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff778);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)__a,file,(size_t)in_stack_fffffffffffff7a8,
                 (const_string *)CONCAT17(in_stack_fffffffffffff7a7,in_stack_fffffffffffff7a0));
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffff788,(bool)in_stack_fffffffffffff787);
      in_stack_fffffffffffff7a8 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780),
                 (char (*) [327])in_stack_fffffffffffff778);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff788,
                 (pointer)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780),
                 (unsigned_long)in_stack_fffffffffffff778);
      in_stack_fffffffffffff778 = (UniValue *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_660,local_680,&local_690,0xe0,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[327],_const_char_(&)[327]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[327],_const_char_(&)[327]>
                          *)in_stack_fffffffffffff778);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff778);
      in_stack_fffffffffffff7a7 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffff7a7);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_createraw_op_return)
{
    BOOST_CHECK_NO_THROW(CallRPC("createrawtransaction [{\"txid\":\"a3b807410df0b60fcb9736768df5823938b2f838694939ba45f3c0a1bff150ed\",\"vout\":0}] {\"data\":\"68656c6c6f776f726c64\"}"));

    // Key not "data" (bad address)
    BOOST_CHECK_THROW(CallRPC("createrawtransaction [{\"txid\":\"a3b807410df0b60fcb9736768df5823938b2f838694939ba45f3c0a1bff150ed\",\"vout\":0}] {\"somedata\":\"68656c6c6f776f726c64\"}"), std::runtime_error);

    // Bad hex encoding of data output
    BOOST_CHECK_THROW(CallRPC("createrawtransaction [{\"txid\":\"a3b807410df0b60fcb9736768df5823938b2f838694939ba45f3c0a1bff150ed\",\"vout\":0}] {\"data\":\"12345\"}"), std::runtime_error);
    BOOST_CHECK_THROW(CallRPC("createrawtransaction [{\"txid\":\"a3b807410df0b60fcb9736768df5823938b2f838694939ba45f3c0a1bff150ed\",\"vout\":0}] {\"data\":\"12345g\"}"), std::runtime_error);

    // Data 81 bytes long
    BOOST_CHECK_NO_THROW(CallRPC("createrawtransaction [{\"txid\":\"a3b807410df0b60fcb9736768df5823938b2f838694939ba45f3c0a1bff150ed\",\"vout\":0}] {\"data\":\"010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081\"}"));
}